

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtoken.cpp
# Opt level: O2

string * parse_util::get_param
                   (string *__return_storage_ptr__,string *instr,string *open_par,string *close_par)

{
  long lVar1;
  allocator local_40 [32];
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_40);
  lVar1 = std::__cxx11::string::find((string *)instr,(ulong)open_par);
  if (lVar1 != -1) {
    std::__cxx11::string::find_last_of((string *)instr,(ulong)close_par);
    std::__cxx11::string::substr((ulong)local_40,(ulong)instr);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

string get_param(const string &instr, const string &open_par,
                     const string &close_par)
    {
        string temp("");
        string::size_type pos = instr.find(open_par);

        if (pos != string::npos) {
            string::size_type end = instr.find_last_of(close_par);
            temp = instr.substr(pos+1, end-pos-1);
        }

        return temp;
    }